

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

int luaS_eqlngstr(TString *a,TString *b)

{
  uint uVar1;
  int iVar2;
  
  if ((a->tt == '\x14') && (b->tt == '\x14')) {
    if (a == b) {
      uVar1 = 1;
    }
    else {
      uVar1 = 0;
      if ((a->u).lnglen == (b->u).lnglen) {
        iVar2 = bcmp(a + 1,b + 1,(a->u).lnglen);
        uVar1 = (uint)(iVar2 == 0);
      }
    }
    return uVar1;
  }
  __assert_fail("a->tt == ((4) | ((1) << 4)) && b->tt == ((4) | ((1) << 4))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                ,0x2a,"int luaS_eqlngstr(TString *, TString *)");
}

Assistant:

int luaS_eqlngstr (TString *a, TString *b) {
  size_t len = a->u.lnglen;
  lua_assert(a->tt == LUA_TLNGSTR && b->tt == LUA_TLNGSTR);
  return (a == b) ||  /* same instance or... */
    ((len == b->u.lnglen) &&  /* equal length and ... */
     (memcmp(getstr(a), getstr(b), len) == 0));  /* equal contents */
}